

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<unsigned_int> * __thiscall
kj::ArrayBuilder<unsigned_int>::operator=
          (ArrayBuilder<unsigned_int> *this,ArrayBuilder<unsigned_int> *other)

{
  uint *puVar1;
  RemoveConst<unsigned_int> *pRVar2;
  uint *puVar3;
  ArrayDisposer *pAVar4;
  
  puVar1 = this->ptr;
  if (puVar1 != (uint *)0x0) {
    pRVar2 = this->pos;
    puVar3 = this->endPtr;
    this->ptr = (uint *)0x0;
    this->pos = (RemoveConst<unsigned_int> *)0x0;
    this->endPtr = (uint *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,puVar1,4,(long)pRVar2 - (long)puVar1 >> 2,
               (long)puVar3 - (long)puVar1 >> 2,0);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (uint *)0x0;
  other->pos = (RemoveConst<unsigned_int> *)0x0;
  other->endPtr = (uint *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }